

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproxystyle.cpp
# Opt level: O0

void __thiscall QProxyStyle::unpolish(QProxyStyle *this,QWidget *widget)

{
  QStyle *pQVar1;
  undefined8 in_RSI;
  QProxyStylePrivate *d;
  QProxyStylePrivate *in_stack_00000018;
  
  d_func((QProxyStyle *)0x40974c);
  QProxyStylePrivate::ensureBaseStyle(in_stack_00000018);
  pQVar1 = QPointer<QStyle>::operator->((QPointer<QStyle> *)0x409769);
  (**(code **)(*(long *)pQVar1 + 0x68))(pQVar1,in_RSI);
  return;
}

Assistant:

void QProxyStyle::unpolish(QWidget *widget)
{
    Q_D (QProxyStyle);
    d->ensureBaseStyle();
    d->baseStyle->unpolish(widget);
}